

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int GmfSetLin(int64_t MshIdx,int KwdCod,...)

{
  char in_AL;
  size_t sVar1;
  unsigned_long in_RCX;
  unsigned_long in_RDX;
  int in_ESI;
  unsigned_long in_RDI;
  uint *in_R8;
  undefined8 in_R9;
  int in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  int64_t in_XMM2_Qa;
  size_t in_XMM3_Qa;
  long in_XMM4_Qa;
  long in_XMM5_Qa;
  long in_XMM6_Qa;
  long in_XMM7_Qa;
  KwdSct *kwd;
  GmfMshSct *msh;
  va_list VarArg;
  double *DblTab;
  double *DblBuf;
  double *DblSolTab;
  float *FltBuf;
  float *FltSolTab;
  int64_t *LngBuf;
  int *RefPtr;
  int *IntTab;
  int typ;
  int err;
  int *IntBuf;
  int pos;
  int i;
  char *str;
  void *in_stack_fffffffffffffce8;
  GmfMshSct *in_stack_fffffffffffffcf0;
  double *local_298;
  double *local_278;
  double *local_260;
  double *local_248;
  double *local_228;
  double *local_208;
  double *local_1f0;
  double *local_1d0;
  double *local_1b0;
  double *local_188;
  undefined1 local_158 [16];
  unsigned_long local_148;
  unsigned_long local_140;
  uint *local_138 [2];
  int local_128;
  int local_118 [4];
  int64_t local_108;
  size_t local_f8;
  long local_e8;
  long local_d8;
  long local_c8;
  long local_b8;
  undefined4 *local_a8;
  unsigned_long local_a0;
  uint local_98;
  uint local_94;
  double *local_90;
  undefined1 *local_88;
  unsigned_long local_78;
  double *local_70;
  unsigned_long local_68;
  float *local_60;
  unsigned_long local_58;
  double *local_50;
  uint *local_48;
  unsigned_long local_40;
  undefined4 local_38;
  int local_34;
  uint *local_30;
  int local_28;
  int local_24;
  char *local_20;
  int local_14;
  unsigned_long local_10;
  int local_4;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Da;
    local_118._0_8_ = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  if (in_ESI < 0) {
    local_14 = -in_ESI;
    local_a8 = (undefined4 *)(in_RDI + 0x110 + (long)local_14 * 0x3300);
    local_38 = 5;
  }
  else {
    local_a8 = (undefined4 *)(in_RDI + 0x110 + (long)in_ESI * 0x3300);
    local_38 = *local_a8;
    local_14 = in_ESI;
  }
  if ((local_14 < 1) || (0xf0 < local_14)) {
    local_4 = 0;
  }
  else {
    local_148 = in_RDX;
    local_140 = in_RCX;
    local_138[0] = in_R8;
    local_138[1] = (uint *)in_R9;
    local_a0 = in_RDI;
    local_10 = in_RDI;
    local_34 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x48));
    if (local_34 == 0) {
      local_34 = _setjmp((__jmp_buf_tag *)(local_a0 + 0x48));
      if (local_34 == 0) {
        local_88 = local_158;
        local_90 = (double *)&stack0x00000008;
        local_94 = 0x30;
        local_98 = 0x10;
        switch(local_38) {
        case 1:
        case 2:
        case 4:
          if ((*(uint *)(local_a0 + 0xc) & 1) == 0) {
            local_28 = 0;
            for (local_24 = 0; local_24 < (int)local_a8[3]; local_24 = local_24 + 1) {
              if (*(char *)((long)local_a8 + (long)local_24 + 0xfd8) == 'r') {
                if (*(int *)(local_a0 + 0x18) == 0x20) {
                  local_60 = (float *)(*(long *)(local_a0 + 0x300428) + (long)local_28);
                  if (local_94 < 0xa1) {
                    local_228 = (double *)(local_88 + (int)local_94);
                    local_94 = local_94 + 0x10;
                  }
                  else {
                    local_228 = local_90;
                    local_90 = local_90 + 1;
                  }
                  *local_60 = (float)*local_228;
                  local_28 = local_28 + 4;
                }
                else {
                  local_70 = (double *)(*(long *)(local_a0 + 0x300428) + (long)local_28);
                  if (local_94 < 0xa1) {
                    local_248 = (double *)(local_88 + (int)local_94);
                    local_94 = local_94 + 0x10;
                  }
                  else {
                    local_248 = local_90;
                    local_90 = local_90 + 1;
                  }
                  *local_70 = *local_248;
                  local_28 = local_28 + 8;
                }
              }
              else if (*(char *)((long)local_a8 + (long)local_24 + 0xfd8) == 'i') {
                if (*(int *)(local_a0 + 4) < 4) {
                  local_30 = (uint *)(*(long *)(local_a0 + 0x300428) + (long)local_28);
                  if (local_98 < 0x29) {
                    local_260 = (double *)(local_88 + (int)local_98);
                    local_98 = local_98 + 8;
                  }
                  else {
                    local_260 = local_90;
                    local_90 = local_90 + 1;
                  }
                  *local_30 = *(uint *)local_260;
                  local_28 = local_28 + 4;
                }
                else {
                  local_50 = (double *)(*(long *)(local_a0 + 0x300428) + (long)local_28);
                  if (local_98 < 0x29) {
                    local_278 = (double *)(local_88 + (int)local_98);
                    local_98 = local_98 + 8;
                  }
                  else {
                    local_278 = local_90;
                    local_90 = local_90 + 1;
                  }
                  *local_50 = *local_278;
                  local_28 = local_28 + 8;
                }
              }
              else if (*(char *)((long)local_a8 + (long)local_24 + 0xfd8) == 'c') {
                memset((void *)(*(long *)(local_a0 + 0x300428) + (long)local_28),0,0x100);
                if (local_98 < 0x29) {
                  local_298 = (double *)(local_88 + (int)local_98);
                  local_98 = local_98 + 8;
                }
                else {
                  local_298 = local_90;
                  local_90 = local_90 + 1;
                }
                strncpy((char *)(*(long *)(local_a0 + 0x300428) + (long)local_28),(char *)*local_298
                        ,0x100);
                local_28 = local_28 + 0x40;
              }
            }
            RecBlk(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0);
          }
          else {
            for (local_24 = 0; local_24 < (int)local_a8[3]; local_24 = local_24 + 1) {
              if (*(char *)((long)local_a8 + (long)local_24 + 0xfd8) == 'r') {
                if (*(int *)(local_a0 + 0x18) == 0x20) {
                  if (local_94 < 0xa1) {
                    local_188 = (double *)(local_88 + (int)local_94);
                    local_94 = local_94 + 0x10;
                  }
                  else {
                    local_188 = local_90;
                    local_90 = local_90 + 1;
                  }
                  fprintf(*(FILE **)(local_a0 + 0x300410),"%.9g ",SUB84(*local_188,0));
                }
                else {
                  if (local_94 < 0xa1) {
                    local_1b0 = (double *)(local_88 + (int)local_94);
                    local_94 = local_94 + 0x10;
                  }
                  else {
                    local_1b0 = local_90;
                    local_90 = local_90 + 1;
                  }
                  fprintf(*(FILE **)(local_a0 + 0x300410),"%.17g ",SUB84(*local_1b0,0));
                }
              }
              else if (*(char *)((long)local_a8 + (long)local_24 + 0xfd8) == 'i') {
                if (*(int *)(local_a0 + 4) < 4) {
                  if (local_98 < 0x29) {
                    local_1d0 = (double *)(local_88 + (int)local_98);
                    local_98 = local_98 + 8;
                  }
                  else {
                    local_1d0 = local_90;
                    local_90 = local_90 + 1;
                  }
                  fprintf(*(FILE **)(local_a0 + 0x300410),"%d ",(ulong)*(uint *)local_1d0);
                }
                else {
                  if (local_98 < 0x29) {
                    local_1f0 = (double *)(local_88 + (int)local_98);
                    local_98 = local_98 + 8;
                  }
                  else {
                    local_1f0 = local_90;
                    local_90 = local_90 + 1;
                  }
                  fprintf(*(FILE **)(local_a0 + 0x300410),"%ld ",*local_1f0);
                }
              }
              else if (*(char *)((long)local_a8 + (long)local_24 + 0xfd8) == 'c') {
                if (local_98 < 0x29) {
                  local_208 = (double *)(local_88 + (int)local_98);
                  local_98 = local_98 + 8;
                }
                else {
                  local_208 = local_90;
                  local_90 = local_90 + 1;
                }
                local_20 = (char *)*local_208;
                sVar1 = strlen(local_20);
                if (0x3f < sVar1) {
                  local_20[0x40] = '\0';
                }
                fputs(local_20,*(FILE **)(local_a0 + 0x300410));
              }
            }
          }
          break;
        case 3:
          if (*(int *)(local_a0 + 0x18) == 0x20) {
            local_94 = 0x30;
            local_98 = 0x18;
            local_58 = local_148;
            if ((*(uint *)(local_a0 + 0xc) & 1) == 0) {
              RecBlk(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0);
            }
            else {
              for (local_24 = 0; local_24 < (int)local_a8[3]; local_24 = local_24 + 1) {
                fprintf(*(FILE **)(local_a0 + 0x300410),"%.9g ",
                        SUB84((double)*(float *)(local_58 + (long)local_24 * 4),0));
              }
            }
          }
          else {
            local_94 = 0x30;
            local_98 = 0x18;
            local_68 = local_148;
            if ((*(uint *)(local_a0 + 0xc) & 1) == 0) {
              RecBlk(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0);
            }
            else {
              for (local_24 = 0; local_24 < (int)local_a8[3]; local_24 = local_24 + 1) {
                fprintf(*(FILE **)(local_a0 + 0x300410),"%.17g ",
                        (int)*(undefined8 *)(local_68 + (long)local_24 * 8));
              }
            }
          }
          break;
        case 5:
          local_94 = 0x30;
          local_40 = local_148;
          local_78 = local_140;
          local_98 = 0x28;
          local_48 = local_138[0];
          if ((*(uint *)(local_a0 + 0xc) & 1) == 0) {
            local_28 = 0;
            for (local_24 = 0; local_24 < (int)local_a8[3]; local_24 = local_24 + 1) {
              if (*(char *)((long)local_a8 + (long)local_24 + 0xfd8) == 'r') {
                if (*(int *)(local_a0 + 0x18) == 0x20) {
                  local_60 = (float *)(*(long *)(local_a0 + 0x300428) + (long)local_28);
                  *local_60 = (float)*(double *)(local_140 + (long)local_24 * 8);
                  local_28 = local_28 + 4;
                }
                else {
                  local_70 = (double *)(*(long *)(local_a0 + 0x300428) + (long)local_28);
                  *local_70 = *(double *)(local_140 + (long)local_24 * 8);
                  local_28 = local_28 + 8;
                }
              }
              else if (*(char *)((long)local_a8 + (long)local_24 + 0xfd8) == 'i') {
                if (*(int *)(local_a0 + 4) < 4) {
                  local_30 = (uint *)(*(long *)(local_a0 + 0x300428) + (long)local_28);
                  if ((F77RefFlg[local_14] == '\0') || (local_24 < local_a8[3] + -1)) {
                    *local_30 = *(uint *)(local_148 + (long)local_24 * 4);
                  }
                  else {
                    *local_30 = *local_138[0];
                  }
                  local_28 = local_28 + 4;
                }
                else {
                  local_50 = (double *)(*(long *)(local_a0 + 0x300428) + (long)local_28);
                  if ((F77RefFlg[local_14] == '\0') || (local_24 < local_a8[3] + -1)) {
                    *local_50 = (double)(long)*(int *)(local_148 + (long)local_24 * 4);
                  }
                  else {
                    *local_50 = (double)(long)(int)*local_138[0];
                  }
                  local_28 = local_28 + 8;
                }
              }
            }
            RecBlk((GmfMshSct *)local_138,in_stack_fffffffffffffce8,0);
          }
          else {
            for (local_24 = 0; local_24 < (int)local_a8[3]; local_24 = local_24 + 1) {
              if (*(char *)((long)local_a8 + (long)local_24 + 0xfd8) == 'r') {
                if (*(int *)(local_a0 + 0x18) == 0x20) {
                  fprintf(*(FILE **)(local_a0 + 0x300410),"%.9g ",
                          SUB84((double)(float)*(double *)(local_78 + (long)local_24 * 8),0));
                }
                else {
                  fprintf(*(FILE **)(local_a0 + 0x300410),"%.17g ",
                          (int)*(undefined8 *)(local_78 + (long)local_24 * 8));
                }
              }
              else if (*(char *)((long)local_a8 + (long)local_24 + 0xfd8) == 'i') {
                if (*(int *)(local_a0 + 4) < 4) {
                  if ((F77RefFlg[local_14] == '\0') || (local_24 < local_a8[3] + -1)) {
                    fprintf(*(FILE **)(local_a0 + 0x300410),"%d ",
                            (ulong)*(uint *)(local_40 + (long)local_24 * 4));
                  }
                  else {
                    fprintf(*(FILE **)(local_a0 + 0x300410),"%d ",(ulong)*local_48);
                  }
                }
                else if ((F77RefFlg[local_14] == '\0') || (local_24 < local_a8[3] + -1)) {
                  fprintf(*(FILE **)(local_a0 + 0x300410),"%ld ",
                          (long)*(int *)(local_40 + (long)local_24 * 4));
                }
                else {
                  fprintf(*(FILE **)(local_a0 + 0x300410),"%ld ",(long)(int)*local_48);
                }
              }
            }
          }
        }
        if ((*(uint *)(local_a0 + 0xc) & 1) != 0) {
          fprintf(*(FILE **)(local_a0 + 0x300410),"\n");
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int GmfSetLin(int64_t MshIdx, int KwdCod, ...)
{
   char        *str;
   int         i, pos, *IntBuf, err, typ, *IntTab, *RefPtr;
   int64_t     *LngBuf;
   float       *FltSolTab, *FltBuf;
   double      *DblSolTab, *DblBuf, *DblTab;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;

   // Special trick: if the kwd is negative the call come from Fortran
   if(KwdCod < 0)
   {
      // Set Fortran mode ON
      KwdCod = -KwdCod;
      kwd = &msh->KwdTab[ KwdCod ];
      typ = F77Kwd;
   }
   else
   {
      kwd = &msh->KwdTab[ KwdCod ];
      typ = kwd->typ;
   }

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);
 
   // Save the current stack environment for longjmp
   // This is needed in RecBlk()
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      return(0);
   }

   // Save the current stack environment for longjmp
   // This is needed in RecBlk()
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      return(0);
   }

   // Start decoding the arguments
   va_start(VarArg, KwdCod);

   switch(typ)
   {
      case InfKwd : case RegKwd : case CmtKwd :
      {
         if(msh->typ & Asc)
         {
            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                     fprintf(msh->hdl, "%.9g ", va_arg(VarArg, double));
                  else
                     fprintf(msh->hdl, "%.17g ", va_arg(VarArg, double));
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                     fprintf(msh->hdl, "%d ", va_arg(VarArg, int));
                  else
                  {
                     // [Bruno] %ld -> INT64_T_FMT
                     fprintf(msh->hdl, INT64_T_FMT " ", va_arg(VarArg, int64_t));
                  }
               }
               else if(kwd->fmt[i] == 'c')
               {
                  // Safety check: if the string is greater than 64 characters
                  // truncate it with an ending 0
                  str = va_arg(VarArg, char *);

                  if(strlen(str) >= FilStrSiz)
                     str[ FilStrSiz ] = 0;

                  fputs(str, msh->hdl);
               }
            }
         }
         else
         {
            pos = 0;

            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                  {
                     FltBuf = (void *)&msh->buf[ pos ];
                     *FltBuf = (float)va_arg(VarArg, double);
                     pos += 4;
                  }
                  else
                  {
                     DblBuf = (void *)&msh->buf[ pos ];
                     *DblBuf = va_arg(VarArg, double);
                     pos += 8;
                  }
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                  {
                     IntBuf = (void *)&msh->buf[ pos ];
                     *IntBuf = va_arg(VarArg, int);
                     pos += 4;
                  }
                  else
                  {
                     LngBuf = (void *)&msh->buf[ pos ];
                     *LngBuf = va_arg(VarArg, int64_t);
                     pos += 8;
                  }
               }
               else if(kwd->fmt[i] == 'c')
               {
                  memset(&msh->buf[ pos ], 0, FilStrSiz * WrdSiz);
                  strncpy(&msh->buf[ pos ], va_arg(VarArg, char *), FilStrSiz * WrdSiz);
                  pos += FilStrSiz;
               }
            }

            RecBlk(msh, msh->buf, kwd->NmbWrd);
         }
      }break;

      case SolKwd :
      {
         if(msh->FltSiz == 32)
         {
            FltSolTab = va_arg(VarArg, float *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  fprintf(msh->hdl, "%.9g ", (double)FltSolTab[i]);
            else
               RecBlk(msh, (unsigned char *)FltSolTab, kwd->NmbWrd);
         }
         else
         {
            DblSolTab = va_arg(VarArg, double *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  fprintf(msh->hdl, "%.17g ", DblSolTab[i]);
            else
               RecBlk(msh, (unsigned char *)DblSolTab, kwd->NmbWrd);
         }
      }break;

      case F77Kwd :
      {
         IntTab = va_arg(VarArg, int *);
         DblTab = va_arg(VarArg, double *);
         RefPtr = va_arg(VarArg, int *);

         if(msh->typ & Asc)
         {
            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                     fprintf(msh->hdl, "%.9g ", (float)DblTab[i]);
                  else
                     fprintf(msh->hdl, "%.17g ", DblTab[i]);
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        fprintf(msh->hdl, "%d ", IntTab[i]);
                     else
                        fprintf(msh->hdl, "%d ", *RefPtr);
                  else
                  {
                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        fprintf(msh->hdl, INT64_T_FMT " ", (int64_t)IntTab[i]);
                     else
                        fprintf(msh->hdl, INT64_T_FMT " ", (int64_t)*RefPtr);
                  }
               }
            }
         }
         else
         {
            pos = 0;

            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                  {
                     FltBuf = (void *)&msh->buf[ pos ];
                     *FltBuf = (float)DblTab[i];
                     pos += 4;
                  }
                  else
                  {
                     DblBuf = (void *)&msh->buf[ pos ];
                     *DblBuf = DblTab[i];
                     pos += 8;
                  }
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                  {
                     IntBuf = (void *)&msh->buf[ pos ];

                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        *IntBuf = IntTab[i];
                     else
                        *IntBuf = *RefPtr;

                     pos += 4;
                  }
                  else
                  {
                     LngBuf = (void *)&msh->buf[ pos ];

                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        *LngBuf = (int64_t)IntTab[i];
                     else
                        *LngBuf = (int64_t)*RefPtr;

                     pos += 8;
                  }
               }
            }

            RecBlk(msh, msh->buf, kwd->NmbWrd);
         }
      }break;
   }

   va_end(VarArg);

   if(msh->typ & Asc)
      fprintf(msh->hdl, "\n");

   return(1);
}